

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

integer_type * __thiscall
toml::basic_value<toml::type_config>::as_integer(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == integer) {
    return (integer_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_integer()","");
  throw_bad_cast(this,&local_38,integer);
}

Assistant:

integer_type& as_integer()
    {
        if(this->type_ != value_t::integer)
        {
            this->throw_bad_cast("toml::value::as_integer()", value_t::integer);
        }
        return this->integer_.value;
    }